

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O2

void __thiscall
btConeTwistConstraint::calcAngleInfo2
          (btConeTwistConstraint *this,btTransform *transA,btTransform *transB,
          btMatrix3x3 *invInertiaWorldA,btMatrix3x3 *invInertiaWorldB)

{
  btConeTwistConstraint *this_00;
  btScalar bVar1;
  btScalar bVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined4 __y;
  undefined4 __y_00;
  btVector3 bVar11;
  btVector3 swingAxis_1;
  btVector3 ivB;
  btScalar swingLimit;
  btScalar swingAngle;
  btVector3 swingAxis;
  btQuaternion qDeltaAB;
  btTransform trDeltaAB;
  btTransform trB;
  btTransform trA;
  btQuaternion qA;
  btVector3 local_260;
  btMatrix3x3 *local_250;
  undefined8 local_248;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  btMatrix3x3 *local_1e8;
  btScalar local_1dc;
  btVector3 local_1d8;
  undefined8 local_1c8;
  btTransform local_1b0;
  btTransform local_170;
  btTransform local_130;
  btTransform local_f0;
  btTransform local_b0;
  btTransform local_70;
  
  this->m_twistLimitSign = 0.0;
  this->m_swingCorrection = 0.0;
  this->m_solveTwistLimit = false;
  this->m_solveSwingLimit = false;
  if ((this->m_bMotorEnabled == true) && (this->m_useSolveConstraintObsolete == false)) {
    btMatrix3x3::setRotation(&local_70.m_basis,&this->m_qTarget);
    local_70.m_origin.m_floats[0] = 0.0;
    local_70.m_origin.m_floats[1] = 0.0;
    local_70.m_origin.m_floats[2] = 0.0;
    local_70.m_origin.m_floats[3] = 0.0;
    btTransform::operator*(&local_b0,transA,&this->m_rbAFrame);
    btTransform::operator*(&local_f0,transB,&this->m_rbBFrame);
    btTransform::operator*(&local_170,&local_f0,&local_70);
    btTransform::inverse(&local_1b0,&local_b0);
    btTransform::operator*(&local_130,&local_170,&local_1b0);
    local_170.m_basis.m_el[0].m_floats = (btScalar  [4])btTransform::getRotation(&local_130);
    local_1b0.m_basis.m_el[0].m_floats._0_12_ = local_170.m_basis.m_el[0].m_floats._0_12_;
    local_1b0.m_basis.m_el[0].m_floats[3] = 0.0;
    bVar1 = btVector3::length2((btVector3 *)&local_1b0);
    if (ABS(bVar1) < 1.1920929e-07) {
      return;
    }
    *(undefined8 *)(this->m_swingAxis).m_floats = local_1b0.m_basis.m_el[0].m_floats._0_8_;
    *(undefined8 *)((this->m_swingAxis).m_floats + 2) = local_1b0.m_basis.m_el[0].m_floats._8_8_;
    btVector3::normalize(&this->m_swingAxis);
    bVar1 = btQuaternion::getAngle((btQuaternion *)&local_170);
    this->m_swingCorrection = bVar1;
    if (ABS(bVar1) < 1.1920929e-07) {
      return;
    }
    this->m_solveSwingLimit = true;
    return;
  }
  local_250 = invInertiaWorldA;
  local_1e8 = invInertiaWorldB;
  local_b0.m_basis.m_el[0].m_floats = (btScalar  [4])btTransform::getRotation(transA);
  local_f0.m_basis.m_el[0].m_floats = (btScalar  [4])btTransform::getRotation(&this->m_rbAFrame);
  local_70.m_basis.m_el[0].m_floats =
       (btScalar  [4])operator*((btQuaternion *)&local_b0,(btQuaternion *)&local_f0);
  local_f0.m_basis.m_el[0].m_floats = (btScalar  [4])btTransform::getRotation(transB);
  local_130.m_basis.m_el[0].m_floats = (btScalar  [4])btTransform::getRotation(&this->m_rbBFrame);
  local_b0.m_basis.m_el[0].m_floats =
       (btScalar  [4])operator*((btQuaternion *)&local_f0,(btQuaternion *)&local_130);
  local_130.m_basis.m_el[0].m_floats._0_8_ =
       local_b0.m_basis.m_el[0].m_floats._0_8_ ^ 0x8000000080000000;
  local_130.m_basis.m_el[0].m_floats[2] = -local_b0.m_basis.m_el[0].m_floats[2];
  local_130.m_basis.m_el[0].m_floats[3] = local_b0.m_basis.m_el[0].m_floats[3];
  local_f0.m_basis.m_el[0].m_floats =
       (btScalar  [4])operator*((btQuaternion *)&local_130,(btQuaternion *)&local_70);
  local_130.m_basis.m_el[0] = quatRotate((btQuaternion *)&local_f0,&vTwist);
  btVector3::normalize((btVector3 *)&local_130);
  local_170.m_basis.m_el[0].m_floats =
       (btScalar  [4])shortestArcQuat(&vTwist,(btVector3 *)&local_130);
  btQuaternion::normalize((btQuaternion *)&local_170);
  uVar5 = local_170.m_basis.m_el[0].m_floats._8_8_ ^ 0x80000000;
  local_260.m_floats[2] = (btScalar)(int)uVar5;
  local_260.m_floats[3] = (btScalar)(int)(uVar5 >> 0x20);
  local_260.m_floats[0] =
       (btScalar)(int)(local_170.m_basis.m_el[0].m_floats._0_8_ ^ 0x8000000080000000);
  local_260.m_floats[1] =
       (btScalar)(int)((local_170.m_basis.m_el[0].m_floats._0_8_ ^ 0x8000000080000000) >> 0x20);
  local_1b0.m_basis.m_el[0].m_floats =
       (btScalar  [4])operator*((btQuaternion *)&local_260,(btQuaternion *)&local_f0);
  btQuaternion::normalize((btQuaternion *)&local_1b0);
  if ((this->m_fixThresh <= this->m_swingSpan1) && (this->m_fixThresh <= this->m_swingSpan2)) {
    local_1dc = 0.0;
    transB = (btTransform *)this;
    computeConeLimitInfo(this,(btQuaternion *)&local_170,local_1d8.m_floats,&local_260,&local_1dc);
    fVar3 = this->m_limitSoftness;
    if (local_1dc * fVar3 < local_1d8.m_floats[0]) {
      this->m_solveSwingLimit = true;
      fVar9 = -local_1dc * fVar3 + local_1d8.m_floats[0];
      this->m_swingLimitRatio =
           (btScalar)
           (~-(uint)(local_1d8.m_floats[0] < local_1dc) & 0x3f800000 |
           (~-(uint)(fVar3 < 0.9999999) & 0x3f800000 |
           (uint)(fVar9 / (-local_1dc * fVar3 + local_1dc)) & -(uint)(fVar3 < 0.9999999)) &
           -(uint)(local_1d8.m_floats[0] < local_1dc));
      this->m_swingCorrection = fVar9;
      adjustSwingAxisToUseEllipseNormal(this,&local_260);
      local_208._0_8_ = local_260.m_floats._0_8_ ^ 0x8000000080000000;
      local_208._8_4_ = -local_260.m_floats[2];
      local_208._12_4_ = 0.0;
      bVar11 = quatRotate((btQuaternion *)&local_b0,(btVector3 *)local_208);
      transB = (btTransform *)&this->m_swingAxis;
      *&(this->m_swingAxis).m_floats = bVar11.m_floats;
      (this->m_twistAxisA).m_floats[0] = 0.0;
      (this->m_twistAxisA).m_floats[1] = 0.0;
      (this->m_twistAxisA).m_floats[2] = 0.0;
      (this->m_twistAxisA).m_floats[3] = 0.0;
      bVar1 = computeAngularImpulseDenominator((btVector3 *)transB,local_250);
      bVar2 = computeAngularImpulseDenominator((btVector3 *)transB,local_1e8);
      this->m_kSwing = 1.0 / (bVar2 + bVar1);
    }
    goto LAB_0016bc99;
  }
  uVar6._0_4_ = 0.0;
  uVar6._4_1_ = false;
  uVar6._5_1_ = false;
  uVar6._6_2_ = 0;
  local_208._4_4_ = (this->m_rbAFrame).m_basis.m_el[1].m_floats[0];
  local_208._0_4_ = (btScalar)(int)*(undefined8 *)(this->m_rbAFrame).m_basis.m_el[0].m_floats;
  local_208._8_4_ = (this->m_rbAFrame).m_basis.m_el[2].m_floats[0];
  local_208._12_4_ = 0.0;
  local_260 = operator*(&transA->m_basis,(btVector3 *)local_208);
  local_1f8 = local_260.m_floats._8_8_;
  local_1c8 = local_260.m_floats._0_8_;
  uVar7 = 0;
  local_208._4_4_ = (this->m_rbAFrame).m_basis.m_el[1].m_floats[1];
  local_208._0_4_ = (btScalar)(int)*(undefined8 *)((this->m_rbAFrame).m_basis.m_el[0].m_floats + 1);
  local_208._8_4_ = (this->m_rbAFrame).m_basis.m_el[2].m_floats[1];
  local_208._12_4_ = 0.0;
  uStack_1f0 = uVar6;
  bVar11 = operator*(&transA->m_basis,(btVector3 *)local_208);
  local_218 = bVar11.m_floats._8_8_;
  local_228 = bVar11.m_floats._0_8_;
  uVar6 = 0;
  local_208._4_4_ = (this->m_rbAFrame).m_basis.m_el[1].m_floats[2];
  local_208._0_4_ = (btScalar)(int)*(undefined8 *)((this->m_rbAFrame).m_basis.m_el[0].m_floats + 2);
  local_208._8_4_ = (this->m_rbAFrame).m_basis.m_el[2].m_floats[2];
  local_208._12_4_ = 0.0;
  uStack_210 = uVar7;
  bVar11 = operator*(&transA->m_basis,(btVector3 *)local_208);
  local_238 = bVar11.m_floats._8_8_;
  local_248 = bVar11.m_floats._0_8_;
  uVar7._0_4_ = 0.0;
  uVar7._4_1_ = false;
  uVar7._5_1_ = false;
  uVar7._6_2_ = 0;
  local_1d8.m_floats[1] = (this->m_rbBFrame).m_basis.m_el[1].m_floats[0];
  local_1d8.m_floats[0] = (btScalar)(int)*(undefined8 *)(this->m_rbBFrame).m_basis.m_el[0].m_floats;
  local_1d8.m_floats[2] = (this->m_rbBFrame).m_basis.m_el[2].m_floats[0];
  local_1d8.m_floats[3] = 0.0;
  uStack_230 = uVar6;
  local_208 = (undefined1  [16])operator*(&transB->m_basis,&local_1d8);
  fVar4 = local_208._0_4_;
  fVar10 = local_208._4_4_;
  fVar8 = local_208._8_4_;
  __y_00 = fVar8 * (float)local_218 + fVar4 * (float)local_228 + local_228._4_4_ * fVar10;
  __y = fVar8 * (float)local_238 + fVar4 * (float)local_248 + local_248._4_4_ * fVar10;
  fVar3 = this->m_swingSpan1;
  fVar9 = this->m_fixThresh;
  if ((fVar3 < fVar9) && (this->m_swingSpan2 < fVar9)) {
    if ((1.1920929e-07 <= ABS((float)__y_00)) || (1.1920929e-07 <= ABS((float)__y))) {
      this->m_solveSwingLimit = true;
      transB = (btTransform *)local_208;
      bVar11 = btVector3::cross((btVector3 *)transB,&local_260);
      (this->m_swingAxis).m_floats[0] = -bVar11.m_floats[0];
      (this->m_swingAxis).m_floats[1] = -bVar11.m_floats[1];
      (this->m_swingAxis).m_floats[2] = -bVar11.m_floats[2];
      (this->m_swingAxis).m_floats[3] = 0.0;
    }
    goto LAB_0016bc99;
  }
  fVar4 = fVar8 * (float)(undefined4)local_1f8 + fVar4 * (float)local_1c8 + fVar10 * local_1c8._4_4_
  ;
  if (fVar9 <= fVar3) {
    if (((1.1920929e-07 <= ABS((float)__y_00)) || (1.1920929e-07 <= ABS(fVar4))) &&
       (this->m_solveSwingLimit = true, fVar9 <= fVar3)) {
      local_1f8._4_4_ = local_208._12_4_;
      local_1f8._0_4_ = __y_00;
      uStack_1f0 = uVar7;
      fVar9 = atan2f((float)__y_00,fVar4);
      fVar3 = this->m_swingSpan1;
      if (fVar9 <= fVar3) {
        __y = 0.0;
        if (-fVar3 <= fVar9) {
          __y_00 = (undefined4)local_1f8;
          goto LAB_0016bbe1;
        }
        fVar4 = cosf(fVar3);
        fVar3 = sinf(this->m_swingSpan1);
        __y = 0.0;
        __y_00 = -fVar3;
      }
      else {
        fVar4 = cosf(fVar3);
        __y_00 = sinf(this->m_swingSpan1);
        __y = 0.0;
      }
      goto LAB_0016bbcc;
    }
  }
  else if (((1.1920929e-07 <= ABS((float)__y)) || (1.1920929e-07 <= ABS(fVar4))) &&
          (this->m_solveSwingLimit = true, fVar9 <= this->m_swingSpan2)) {
    local_1f8._4_4_ = local_208._12_4_;
    local_1f8._0_4_ = __y;
    uStack_1f0 = uVar7;
    fVar9 = atan2f((float)__y,fVar4);
    fVar3 = this->m_swingSpan2;
    if (fVar9 <= fVar3) {
      if (-fVar3 <= fVar9) {
        __y = (undefined4)local_1f8;
        __y_00 = 0.0;
        goto LAB_0016bbe1;
      }
      fVar4 = cosf(fVar3);
      fVar3 = sinf(this->m_swingSpan2);
      __y_00 = 0.0;
      __y = -fVar3;
    }
    else {
      fVar4 = cosf(fVar3);
      __y = sinf(this->m_swingSpan2);
      __y_00 = 0.0;
    }
LAB_0016bbcc:
  }
LAB_0016bbe1:
  local_1d8.m_floats[1] =
       (float)__y * local_248._4_4_ +
       fVar4 * local_260.m_floats[1] + local_228._4_4_ * (float)__y_00;
  local_1d8.m_floats[0] =
       (float)__y * (float)local_248 +
       fVar4 * local_260.m_floats[0] + (float)local_228 * (float)__y_00;
  local_1d8.m_floats[2] =
       (float)local_238 * (float)__y +
       fVar4 * local_260.m_floats[2] + (float)local_218 * (float)__y_00;
  btVector3::normalize(&local_1d8);
  bVar11 = btVector3::cross((btVector3 *)local_208,&local_1d8);
  this_00 = (btConeTwistConstraint *)&this->m_swingAxis;
  (this->m_swingAxis).m_floats[0] = -bVar11.m_floats[0];
  (this->m_swingAxis).m_floats[1] = -bVar11.m_floats[1];
  (this->m_swingAxis).m_floats[2] = -bVar11.m_floats[2];
  (this->m_swingAxis).m_floats[3] = 0.0;
  transB = (btTransform *)this_00;
  bVar1 = btVector3::length((btVector3 *)this_00);
  this->m_swingCorrection = bVar1;
  if (1.1920929e-07 <= ABS(bVar1)) {
    btVector3::normalize((btVector3 *)this_00);
    transB = (btTransform *)this_00;
  }
LAB_0016bc99:
  if (0.0 <= this->m_twistSpan) {
    computeTwistLimitInfo
              ((btConeTwistConstraint *)transB,(btQuaternion *)&local_1b0,&this->m_twistAngle,
               &local_260);
    fVar3 = this->m_twistAngle;
    fVar9 = this->m_limitSoftness;
    fVar4 = this->m_twistSpan;
    if (fVar4 * fVar9 < fVar3) {
      this->m_solveTwistLimit = true;
      fVar10 = -fVar4 * fVar9 + fVar3;
      this->m_twistLimitRatio =
           (btScalar)
           (~-(uint)(fVar3 < fVar4) & 0x3f800000 |
           (~-(uint)(fVar9 < 0.9999999) & 0x3f800000 |
           (uint)(fVar10 / (-fVar4 * fVar9 + fVar4)) & -(uint)(fVar9 < 0.9999999)) &
           -(uint)(fVar3 < fVar4));
      this->m_twistCorrection = fVar10;
      local_208._0_8_ = local_260.m_floats._0_8_ ^ 0x8000000080000000;
      local_208._8_4_ = -local_260.m_floats[2];
      local_208._12_4_ = 0.0;
      bVar11 = quatRotate((btQuaternion *)&local_b0,(btVector3 *)local_208);
      *&(this->m_twistAxis).m_floats = bVar11.m_floats;
      bVar1 = computeAngularImpulseDenominator(&this->m_twistAxis,local_250);
      local_250 = (btMatrix3x3 *)CONCAT44(local_250._4_4_,bVar1);
      bVar1 = computeAngularImpulseDenominator(&this->m_twistAxis,local_1e8);
      this->m_kTwist = 1.0 / (bVar1 + local_250._0_4_);
    }
    if (this->m_solveSwingLimit == true) {
      local_208._0_8_ = local_260.m_floats._0_8_ ^ 0x8000000080000000;
      local_208._8_4_ = -local_260.m_floats[2];
      local_208._12_4_ = 0.0;
      bVar11 = quatRotate((btQuaternion *)&local_70,(btVector3 *)local_208);
      *&(this->m_twistAxisA).m_floats = bVar11.m_floats;
    }
  }
  else {
    this->m_twistAngle = 0.0;
  }
  return;
}

Assistant:

void btConeTwistConstraint::calcAngleInfo2(const btTransform& transA, const btTransform& transB, const btMatrix3x3& invInertiaWorldA,const btMatrix3x3& invInertiaWorldB)
{
	m_swingCorrection = btScalar(0.);
	m_twistLimitSign = btScalar(0.);
	m_solveTwistLimit = false;
	m_solveSwingLimit = false;
	// compute rotation of A wrt B (in constraint space)
	if (m_bMotorEnabled && (!m_useSolveConstraintObsolete))
	{	// it is assumed that setMotorTarget() was alredy called 
		// and motor target m_qTarget is within constraint limits
		// TODO : split rotation to pure swing and pure twist
		// compute desired transforms in world
		btTransform trPose(m_qTarget);
		btTransform trA = transA * m_rbAFrame;
		btTransform trB = transB * m_rbBFrame;
		btTransform trDeltaAB = trB * trPose * trA.inverse();
		btQuaternion qDeltaAB = trDeltaAB.getRotation();
		btVector3 swingAxis = 	btVector3(qDeltaAB.x(), qDeltaAB.y(), qDeltaAB.z());
		float swingAxisLen2 = swingAxis.length2();
		if(btFuzzyZero(swingAxisLen2))
		{
		   return;
		}
		m_swingAxis = swingAxis;
		m_swingAxis.normalize();
		m_swingCorrection = qDeltaAB.getAngle();
		if(!btFuzzyZero(m_swingCorrection))
		{
			m_solveSwingLimit = true;
		}
		return;
	}


	{
		// compute rotation of A wrt B (in constraint space)
		btQuaternion qA = transA.getRotation() * m_rbAFrame.getRotation();
		btQuaternion qB = transB.getRotation() * m_rbBFrame.getRotation();
		btQuaternion qAB = qB.inverse() * qA;
		// split rotation into cone and twist
		// (all this is done from B's perspective. Maybe I should be averaging axes...)
		btVector3 vConeNoTwist = quatRotate(qAB, vTwist); vConeNoTwist.normalize();
		btQuaternion qABCone  = shortestArcQuat(vTwist, vConeNoTwist); qABCone.normalize();
		btQuaternion qABTwist = qABCone.inverse() * qAB; qABTwist.normalize();

		if (m_swingSpan1 >= m_fixThresh && m_swingSpan2 >= m_fixThresh)
		{
			btScalar swingAngle, swingLimit = 0; btVector3 swingAxis;
			computeConeLimitInfo(qABCone, swingAngle, swingAxis, swingLimit);

			if (swingAngle > swingLimit * m_limitSoftness)
			{
				m_solveSwingLimit = true;

				// compute limit ratio: 0->1, where
				// 0 == beginning of soft limit
				// 1 == hard/real limit
				m_swingLimitRatio = 1.f;
				if (swingAngle < swingLimit && m_limitSoftness < 1.f - SIMD_EPSILON)
				{
					m_swingLimitRatio = (swingAngle - swingLimit * m_limitSoftness)/
										(swingLimit - swingLimit * m_limitSoftness);
				}				

				// swing correction tries to get back to soft limit
				m_swingCorrection = swingAngle - (swingLimit * m_limitSoftness);

				// adjustment of swing axis (based on ellipse normal)
				adjustSwingAxisToUseEllipseNormal(swingAxis);

				// Calculate necessary axis & factors		
				m_swingAxis = quatRotate(qB, -swingAxis);

				m_twistAxisA.setValue(0,0,0);

				m_kSwing =  btScalar(1.) /
					(computeAngularImpulseDenominator(m_swingAxis,invInertiaWorldA) +
					 computeAngularImpulseDenominator(m_swingAxis,invInertiaWorldB));
			}
		}
		else
		{
			// you haven't set any limits;
			// or you're trying to set at least one of the swing limits too small. (if so, do you really want a conetwist constraint?)
			// anyway, we have either hinge or fixed joint
			btVector3 ivA = transA.getBasis() * m_rbAFrame.getBasis().getColumn(0);
			btVector3 jvA = transA.getBasis() * m_rbAFrame.getBasis().getColumn(1);
			btVector3 kvA = transA.getBasis() * m_rbAFrame.getBasis().getColumn(2);
			btVector3 ivB = transB.getBasis() * m_rbBFrame.getBasis().getColumn(0);
			btVector3 target;
			btScalar x = ivB.dot(ivA);
			btScalar y = ivB.dot(jvA);
			btScalar z = ivB.dot(kvA);
			if((m_swingSpan1 < m_fixThresh) && (m_swingSpan2 < m_fixThresh))
			{ // fixed. We'll need to add one more row to constraint
				if((!btFuzzyZero(y)) || (!(btFuzzyZero(z))))
				{
					m_solveSwingLimit = true;
					m_swingAxis = -ivB.cross(ivA);
				}
			}
			else
			{
				if(m_swingSpan1 < m_fixThresh)
				{ // hinge around Y axis
//					if(!(btFuzzyZero(y)))
					if((!(btFuzzyZero(x))) || (!(btFuzzyZero(z))))
					{
						m_solveSwingLimit = true;
						if(m_swingSpan2 >= m_fixThresh)
						{
							y = btScalar(0.f);
							btScalar span2 = btAtan2(z, x);
							if(span2 > m_swingSpan2)
							{
								x = btCos(m_swingSpan2);
								z = btSin(m_swingSpan2);
							}
							else if(span2 < -m_swingSpan2)
							{
								x =  btCos(m_swingSpan2);
								z = -btSin(m_swingSpan2);
							}
						}
					}
				}
				else
				{ // hinge around Z axis
//					if(!btFuzzyZero(z))
					if((!(btFuzzyZero(x))) || (!(btFuzzyZero(y))))
					{
						m_solveSwingLimit = true;
						if(m_swingSpan1 >= m_fixThresh)
						{
							z = btScalar(0.f);
							btScalar span1 = btAtan2(y, x);
							if(span1 > m_swingSpan1)
							{
								x = btCos(m_swingSpan1);
								y = btSin(m_swingSpan1);
							}
							else if(span1 < -m_swingSpan1)
							{
								x =  btCos(m_swingSpan1);
								y = -btSin(m_swingSpan1);
							}
						}
					}
				}
				target[0] = x * ivA[0] + y * jvA[0] + z * kvA[0];
				target[1] = x * ivA[1] + y * jvA[1] + z * kvA[1];
				target[2] = x * ivA[2] + y * jvA[2] + z * kvA[2];
				target.normalize();
				m_swingAxis = -ivB.cross(target);
                                m_swingCorrection = m_swingAxis.length();

                                if (!btFuzzyZero(m_swingCorrection))
                                    m_swingAxis.normalize();
			}
		}

		if (m_twistSpan >= btScalar(0.f))
		{
			btVector3 twistAxis;
			computeTwistLimitInfo(qABTwist, m_twistAngle, twistAxis);

			if (m_twistAngle > m_twistSpan*m_limitSoftness)
			{
				m_solveTwistLimit = true;

				m_twistLimitRatio = 1.f;
				if (m_twistAngle < m_twistSpan && m_limitSoftness < 1.f - SIMD_EPSILON)
				{
					m_twistLimitRatio = (m_twistAngle - m_twistSpan * m_limitSoftness)/
										(m_twistSpan  - m_twistSpan * m_limitSoftness);
				}

				// twist correction tries to get back to soft limit
				m_twistCorrection = m_twistAngle - (m_twistSpan * m_limitSoftness);

				m_twistAxis = quatRotate(qB, -twistAxis);

				m_kTwist = btScalar(1.) /
					(computeAngularImpulseDenominator(m_twistAxis,invInertiaWorldA) +
					 computeAngularImpulseDenominator(m_twistAxis,invInertiaWorldB));
			}

			if (m_solveSwingLimit)
				m_twistAxisA = quatRotate(qA, -twistAxis);
		}
		else
		{
			m_twistAngle = btScalar(0.f);
		}
	}
}